

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentMap.cpp
# Opt level: O1

void __thiscall
EnvironmentMap::create_descriptors(EnvironmentMap *this,shared_ptr<myvk::Device> *device)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  _func_int **pp_Var4;
  element_type *peVar5;
  initializer_list<VkDescriptorPoolSize> __l;
  VkSampler immutable_samplers [1];
  undefined1 local_b8 [16];
  DescriptorSet local_a8;
  DescriptorPool local_68;
  initializer_list<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_> local_38;
  VkSampler local_28;
  
  local_b8._0_4_ = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  local_b8._4_4_ = 2;
  __l._M_len = 1;
  __l._M_array = (iterator)local_b8;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            ((vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)
             (local_b8 + 0x10),__l,(allocator_type *)&local_38);
  myvk::DescriptorPool::Create
            (&local_68,device,1,
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)
             (local_b8 + 0x10));
  peVar5 = local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
           _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pp_Var4 = local_68.super_DeviceObjectBase.super_Base._vptr_Base;
  local_68.super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
  local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  p_Var1 = (this->m_descriptor_pool).
           super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_descriptor_pool).super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pp_Var4;
  (this->m_descriptor_pool).super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_a8.super_DeviceObjectBase.super_Base._vptr_Base !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_a8.super_DeviceObjectBase.super_Base._vptr_Base,
                    (long)local_a8.super_DeviceObjectBase.super_Base.
                          super_enable_shared_from_this<myvk::Base>._M_weak_this.
                          super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                    - (long)local_a8.super_DeviceObjectBase.super_Base._vptr_Base);
  }
  local_28 = ((this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->m_sampler;
  local_a8.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_28;
  local_a8.super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x100000000;
  local_a8.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x3000000001;
  local_a8.m_descriptor_pool_ptr.
  super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 4;
  local_a8.m_descriptor_pool_ptr.
  super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  local_a8.m_descriptor_set_layout_ptr.
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x2000000001;
  local_a8.m_descriptor_set._0_4_ = 4;
  local_38._M_len = 2;
  local_a8.m_descriptor_set_layout_ptr.
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_a8.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
       _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_38._M_array = (iterator)(local_b8 + 0x10);
  myvk::DescriptorBindingFlagGroup::DescriptorBindingFlagGroup
            ((DescriptorBindingFlagGroup *)&local_68,&local_38);
  myvk::DescriptorSetLayout::Create
            ((DescriptorSetLayout *)local_b8,device,(DescriptorBindingFlagGroup *)&local_68);
  uVar3 = local_b8._8_8_;
  uVar2 = local_b8._0_8_;
  local_b8._0_4_ = VK_DESCRIPTOR_TYPE_SAMPLER;
  local_b8._4_4_ = 0;
  local_b8._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_descriptor_set_layout).
           super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_descriptor_set_layout).
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->m_descriptor_set_layout).
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((element_type *)local_b8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
  if (local_68.m_device_ptr.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    operator_delete(local_68.m_device_ptr.
                    super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (long)local_68.m_descriptor_pool -
                    (long)local_68.m_device_ptr.
                          super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (local_68.super_DeviceObjectBase.super_Base._vptr_Base != (_func_int **)0x0) {
    operator_delete(local_68.super_DeviceObjectBase.super_Base._vptr_Base,
                    (long)local_68.super_DeviceObjectBase.super_Base.
                          super_enable_shared_from_this<myvk::Base>._M_weak_this.
                          super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                    - (long)local_68.super_DeviceObjectBase.super_Base._vptr_Base);
  }
  myvk::DescriptorSet::Create
            ((DescriptorSet *)(local_b8 + 0x10),&this->m_descriptor_pool,
             &this->m_descriptor_set_layout);
  peVar5 = local_a8.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
           _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pp_Var4 = local_a8.super_DeviceObjectBase.super_Base._vptr_Base;
  local_a8.super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
  local_a8.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  p_Var1 = (this->m_descriptor_set).
           super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_descriptor_set).super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pp_Var4;
  (this->m_descriptor_set).super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((element_type *)
      local_a8.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a8.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void EnvironmentMap::create_descriptors(const std::shared_ptr<myvk::Device> &device) {
	m_descriptor_pool = myvk::DescriptorPool::Create(device, 1, {{VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, 2}});
	{
		VkSampler immutable_samplers[] = {m_sampler->GetHandle()};

		VkDescriptorSetLayoutBinding hdr_image_binding = {};
		hdr_image_binding.binding = 0;
		hdr_image_binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		hdr_image_binding.descriptorCount = 1;
		hdr_image_binding.stageFlags = VK_SHADER_STAGE_FRAGMENT_BIT | VK_SHADER_STAGE_COMPUTE_BIT;
		hdr_image_binding.pImmutableSamplers = immutable_samplers;

		VkDescriptorSetLayoutBinding alias_table_image_binding = {};
		alias_table_image_binding.binding = 1;
		alias_table_image_binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		alias_table_image_binding.descriptorCount = 1;
		alias_table_image_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT;
		alias_table_image_binding.pImmutableSamplers = immutable_samplers;

		m_descriptor_set_layout = myvk::DescriptorSetLayout::Create(
		    device, {{hdr_image_binding, VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT},
		             {alias_table_image_binding, VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT}});
	}
	m_descriptor_set = myvk::DescriptorSet::Create(m_descriptor_pool, m_descriptor_set_layout);
}